

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx2::OrientedDiscMiMBIntersectorK<8,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  byte bVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  uint uVar36;
  uint uVar37;
  int iVar38;
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  ulong uVar48;
  long lVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [64];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  RayHitK<4> *local_2e0;
  size_t local_2d8;
  RTCFilterFunctionNArguments local_2d0;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  RTCHitN local_230 [16];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 local_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint local_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [32];
  uint local_80 [4];
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar71 [64];
  
  pSVar9 = context->scene;
  local_80[0] = Disc->sharedGeomID;
  pGVar10 = (pSVar9->geometries).items[local_80[0]].ptr;
  fVar1 = (pGVar10->time_range).lower;
  fVar19 = pGVar10->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar10->time_range).upper - fVar1));
  auVar78 = vroundss_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),9);
  auVar78 = vminss_avx(auVar78,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar78 = vmaxss_avx(ZEXT816(0) << 0x20,auVar78);
  iVar38 = (int)auVar78._0_4_;
  uVar40 = (ulong)(Disc->primIDs).field_0.i[0];
  lVar49 = *(long *)&pGVar10[2].numPrimitives;
  lVar47 = (long)iVar38 * 0x38;
  lVar11 = *(long *)(lVar49 + 0x10 + lVar47);
  lVar41 = *(long *)(lVar49 + lVar47);
  uVar45 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar48 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar39 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar44 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar57._16_16_ = *(undefined1 (*) [16])(lVar41 + lVar11 * uVar44);
  auVar57._0_16_ = *(undefined1 (*) [16])(lVar41 + lVar11 * uVar40);
  uVar42 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar79._16_16_ = *(undefined1 (*) [16])(lVar41 + lVar11 * uVar42);
  auVar79._0_16_ = *(undefined1 (*) [16])(lVar41 + lVar11 * uVar45);
  uVar46 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar59._16_16_ = *(undefined1 (*) [16])(lVar41 + lVar11 * uVar46);
  auVar59._0_16_ = *(undefined1 (*) [16])(lVar41 + lVar11 * uVar48);
  uVar43 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar60._16_16_ = *(undefined1 (*) [16])(lVar41 + lVar11 * uVar43);
  auVar60._0_16_ = *(undefined1 (*) [16])(lVar41 + lVar11 * uVar39);
  p_Var12 = pGVar10[2].intersectionFilterN;
  lVar11 = *(long *)(p_Var12 + lVar47);
  lVar41 = *(long *)(p_Var12 + lVar47 + 0x10);
  auVar64._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar41 * uVar44);
  auVar64._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar41 * uVar40);
  auVar66._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar41 * uVar42);
  auVar66._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar41 * uVar45);
  auVar72._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar41 * uVar46);
  auVar72._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar41 * uVar48);
  auVar76._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar41 * uVar43);
  auVar76._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar41 * uVar39);
  lVar41 = (long)(iVar38 + 1) * 0x38;
  lVar11 = *(long *)(lVar49 + lVar41);
  lVar49 = *(long *)(lVar49 + 0x10 + lVar41);
  auVar81._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar49 * uVar44);
  auVar81._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar49 * uVar40);
  auVar83._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar49 * uVar42);
  auVar83._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar49 * uVar45);
  auVar86._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar49 * uVar46);
  auVar86._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar49 * uVar48);
  auVar88._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar49 * uVar43);
  auVar88._0_16_ = *(undefined1 (*) [16])(lVar11 + lVar49 * uVar39);
  lVar49 = *(long *)(p_Var12 + lVar41);
  lVar11 = *(long *)(p_Var12 + lVar41 + 0x10);
  auVar50._16_16_ = *(undefined1 (*) [16])(lVar49 + uVar44 * lVar11);
  auVar50._0_16_ = *(undefined1 (*) [16])(lVar49 + uVar40 * lVar11);
  fVar19 = fVar19 - auVar78._0_4_;
  auVar63 = vunpcklps_avx(auVar57,auVar59);
  auVar59 = vunpckhps_avx(auVar57,auVar59);
  auVar57 = vunpcklps_avx(auVar79,auVar60);
  local_300 = vunpckhps_avx(auVar79,auVar60);
  auVar20 = vunpcklps_avx(auVar63,auVar57);
  local_a0 = vunpckhps_avx(auVar63,auVar57);
  auVar51 = vunpcklps_avx(auVar64,auVar72);
  auVar63 = vunpckhps_avx(auVar64,auVar72);
  auVar21 = vunpcklps_avx(auVar66,auVar76);
  auVar57 = vunpckhps_avx(auVar66,auVar76);
  auVar67._16_16_ = *(undefined1 (*) [16])(lVar49 + uVar46 * lVar11);
  auVar67._0_16_ = *(undefined1 (*) [16])(lVar49 + uVar48 * lVar11);
  auVar22 = vunpcklps_avx(auVar63,auVar57);
  auVar23 = vunpcklps_avx(auVar51,auVar21);
  auVar63 = vunpckhps_avx(auVar51,auVar21);
  auVar57 = vunpcklps_avx(auVar81,auVar86);
  local_260 = vunpckhps_avx(auVar81,auVar86);
  auVar51 = vunpcklps_avx(auVar83,auVar88);
  local_2a0 = vunpckhps_avx(auVar83,auVar88);
  auVar55 = vunpcklps_avx(auVar57,auVar51);
  auVar51 = vunpckhps_avx(auVar57,auVar51);
  auVar24 = vunpcklps_avx(auVar50,auVar67);
  auVar57 = vunpckhps_avx(auVar50,auVar67);
  auVar73._16_16_ = *(undefined1 (*) [16])(lVar49 + uVar42 * lVar11);
  auVar73._0_16_ = *(undefined1 (*) [16])(lVar49 + uVar45 * lVar11);
  auVar68._16_16_ = *(undefined1 (*) [16])(lVar49 + lVar11 * uVar43);
  auVar68._0_16_ = *(undefined1 (*) [16])(lVar49 + uVar39 * lVar11);
  auVar50 = vunpcklps_avx(auVar73,auVar68);
  auVar21 = vunpckhps_avx(auVar73,auVar68);
  auVar21 = vunpcklps_avx(auVar57,auVar21);
  auVar54 = vunpcklps_avx(auVar24,auVar50);
  auVar57 = vunpckhps_avx(auVar24,auVar50);
  fVar1 = 1.0 - fVar19;
  auVar74._4_4_ = fVar1;
  auVar74._0_4_ = fVar1;
  auVar74._8_4_ = fVar1;
  auVar74._12_4_ = fVar1;
  auVar74._16_4_ = fVar1;
  auVar74._20_4_ = fVar1;
  auVar74._24_4_ = fVar1;
  auVar74._28_4_ = fVar1;
  auVar69._0_4_ = fVar19 * auVar55._0_4_;
  auVar69._4_4_ = fVar19 * auVar55._4_4_;
  auVar69._8_4_ = fVar19 * auVar55._8_4_;
  auVar69._12_4_ = fVar19 * auVar55._12_4_;
  auVar69._16_4_ = fVar19 * auVar55._16_4_;
  auVar69._20_4_ = fVar19 * auVar55._20_4_;
  auVar69._24_4_ = fVar19 * auVar55._24_4_;
  auVar69._28_4_ = 0;
  auVar78 = vfmadd231ps_fma(auVar69,auVar74,auVar20);
  auVar24._4_4_ = fVar19 * auVar54._4_4_;
  auVar24._0_4_ = fVar19 * auVar54._0_4_;
  auVar24._8_4_ = fVar19 * auVar54._8_4_;
  auVar24._12_4_ = fVar19 * auVar54._12_4_;
  auVar24._16_4_ = fVar19 * auVar54._16_4_;
  auVar24._20_4_ = fVar19 * auVar54._20_4_;
  auVar24._24_4_ = fVar19 * auVar54._24_4_;
  auVar24._28_4_ = auVar20._28_4_;
  auVar58._0_4_ = fVar19 * auVar57._0_4_;
  auVar58._4_4_ = fVar19 * auVar57._4_4_;
  auVar58._8_4_ = fVar19 * auVar57._8_4_;
  auVar58._12_4_ = fVar19 * auVar57._12_4_;
  auVar58._16_4_ = fVar19 * auVar57._16_4_;
  auVar58._20_4_ = fVar19 * auVar57._20_4_;
  auVar58._24_4_ = fVar19 * auVar57._24_4_;
  auVar58._28_4_ = 0;
  auVar20._4_4_ = fVar19 * auVar21._4_4_;
  auVar20._0_4_ = fVar19 * auVar21._0_4_;
  auVar20._8_4_ = fVar19 * auVar21._8_4_;
  auVar20._12_4_ = fVar19 * auVar21._12_4_;
  auVar20._16_4_ = fVar19 * auVar21._16_4_;
  auVar20._20_4_ = fVar19 * auVar21._20_4_;
  auVar20._24_4_ = fVar19 * auVar21._24_4_;
  auVar20._28_4_ = auVar57._28_4_;
  auVar25 = vfmadd231ps_fma(auVar24,auVar74,auVar23);
  auVar26 = vfmadd231ps_fma(auVar58,auVar74,auVar63);
  auVar27 = vfmadd231ps_fma(auVar20,auVar74,auVar22);
  bVar8 = Disc->numPrimitives;
  local_80[1] = local_80[0];
  local_80[2] = local_80[0];
  local_80[3] = local_80[0];
  uStack_70 = local_80[0];
  uStack_6c = local_80[0];
  uStack_68 = local_80[0];
  uStack_64 = local_80[0];
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  auVar89._4_4_ = fVar1;
  auVar89._0_4_ = fVar1;
  auVar89._8_4_ = fVar1;
  auVar89._12_4_ = fVar1;
  auVar89._16_4_ = fVar1;
  auVar89._20_4_ = fVar1;
  auVar89._24_4_ = fVar1;
  auVar89._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x50);
  local_e0._4_4_ = fVar2;
  local_e0._0_4_ = fVar2;
  local_e0._8_4_ = fVar2;
  local_e0._12_4_ = fVar2;
  local_e0._16_4_ = fVar2;
  local_e0._20_4_ = fVar2;
  local_e0._24_4_ = fVar2;
  local_e0._28_4_ = fVar2;
  local_c0 = *(float *)(ray + k * 4 + 0x60);
  fStack_bc = local_c0;
  fStack_b8 = local_c0;
  fStack_b4 = local_c0;
  fStack_b0 = local_c0;
  fStack_ac = local_c0;
  fStack_a8 = local_c0;
  fStack_a4 = local_c0;
  auVar63._4_4_ = auVar27._4_4_ * local_c0;
  auVar63._0_4_ = auVar27._0_4_ * local_c0;
  auVar63._8_4_ = auVar27._8_4_ * local_c0;
  auVar63._12_4_ = auVar27._12_4_ * local_c0;
  auVar63._16_4_ = local_c0 * 0.0;
  auVar63._20_4_ = local_c0 * 0.0;
  auVar63._24_4_ = local_c0 * 0.0;
  auVar63._28_4_ = local_c0;
  auVar28 = vfmadd231ps_fma(auVar63,local_e0,ZEXT1632(auVar26));
  auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),auVar89,ZEXT1632(auVar25));
  auVar54._8_4_ = 0x3f800000;
  auVar54._0_8_ = &DAT_3f8000003f800000;
  auVar54._12_4_ = 0x3f800000;
  auVar54._16_4_ = 0x3f800000;
  auVar54._20_4_ = 0x3f800000;
  auVar54._24_4_ = 0x3f800000;
  auVar54._28_4_ = 0x3f800000;
  auVar57 = vcmpps_avx(ZEXT1632(auVar28),ZEXT832(0) << 0x20,4);
  auVar63 = vblendvps_avx(auVar54,ZEXT1632(auVar28),auVar57);
  auVar21._4_4_ = fVar19 * auVar51._4_4_;
  auVar21._0_4_ = fVar19 * auVar51._0_4_;
  auVar21._8_4_ = fVar19 * auVar51._8_4_;
  auVar21._12_4_ = fVar19 * auVar51._12_4_;
  auVar21._16_4_ = fVar19 * auVar51._16_4_;
  auVar21._20_4_ = fVar19 * auVar51._20_4_;
  auVar21._24_4_ = fVar19 * auVar51._24_4_;
  auVar21._28_4_ = auVar51._28_4_;
  auVar28 = vfmadd231ps_fma(auVar21,auVar74,local_a0);
  auVar51 = vunpcklps_avx(local_260,local_2a0);
  auVar22._4_4_ = fVar19 * auVar51._4_4_;
  auVar22._0_4_ = fVar19 * auVar51._0_4_;
  auVar22._8_4_ = fVar19 * auVar51._8_4_;
  auVar22._12_4_ = fVar19 * auVar51._12_4_;
  auVar22._16_4_ = fVar19 * auVar51._16_4_;
  auVar22._20_4_ = fVar19 * auVar51._20_4_;
  auVar22._24_4_ = fVar19 * auVar51._24_4_;
  auVar22._28_4_ = local_2a0._28_4_;
  auVar51 = vunpcklps_avx(auVar59,local_300);
  auVar29 = vfmadd231ps_fma(auVar22,auVar74,auVar51);
  fVar3 = *(float *)(ray + k * 4 + 0x20);
  auVar51._4_4_ = fVar3;
  auVar51._0_4_ = fVar3;
  auVar51._8_4_ = fVar3;
  auVar51._12_4_ = fVar3;
  auVar51._16_4_ = fVar3;
  auVar51._20_4_ = fVar3;
  auVar51._24_4_ = fVar3;
  auVar51._28_4_ = fVar3;
  auVar51 = vsubps_avx(ZEXT1632(auVar29),auVar51);
  auVar23._4_4_ = auVar27._4_4_ * auVar51._4_4_;
  auVar23._0_4_ = auVar27._0_4_ * auVar51._0_4_;
  auVar23._8_4_ = auVar27._8_4_ * auVar51._8_4_;
  auVar23._12_4_ = auVar27._12_4_ * auVar51._12_4_;
  auVar23._16_4_ = auVar51._16_4_ * 0.0;
  auVar23._20_4_ = auVar51._20_4_ * 0.0;
  auVar23._24_4_ = auVar51._24_4_ * 0.0;
  auVar23._28_4_ = auVar55._28_4_;
  fVar4 = *(float *)(ray + k * 4 + 0x10);
  auVar55._4_4_ = fVar4;
  auVar55._0_4_ = fVar4;
  auVar55._8_4_ = fVar4;
  auVar55._12_4_ = fVar4;
  auVar55._16_4_ = fVar4;
  auVar55._20_4_ = fVar4;
  auVar55._24_4_ = fVar4;
  auVar55._28_4_ = fVar4;
  auVar51 = vsubps_avx(ZEXT1632(auVar28),auVar55);
  auVar30 = vfmadd231ps_fma(auVar23,ZEXT1632(auVar26),auVar51);
  fVar5 = *(float *)(ray + k * 4);
  auVar61._4_4_ = fVar5;
  auVar61._0_4_ = fVar5;
  auVar61._8_4_ = fVar5;
  auVar61._12_4_ = fVar5;
  auVar61._16_4_ = fVar5;
  auVar61._20_4_ = fVar5;
  auVar61._24_4_ = fVar5;
  auVar61._28_4_ = fVar5;
  auVar51 = vsubps_avx(ZEXT1632(auVar78),auVar61);
  auVar30 = vfmadd231ps_fma(ZEXT1632(auVar30),ZEXT1632(auVar25),auVar51);
  local_320 = vdivps_avx(ZEXT1632(auVar30),auVar63);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar65._4_4_ = uVar6;
  auVar65._0_4_ = uVar6;
  auVar65._8_4_ = uVar6;
  auVar65._12_4_ = uVar6;
  auVar65._16_4_ = uVar6;
  auVar65._20_4_ = uVar6;
  auVar65._24_4_ = uVar6;
  auVar65._28_4_ = uVar6;
  auVar63 = vcmpps_avx(auVar65,local_320,2);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar84._4_4_ = uVar6;
  auVar84._0_4_ = uVar6;
  auVar84._8_4_ = uVar6;
  auVar84._12_4_ = uVar6;
  auVar84._16_4_ = uVar6;
  auVar84._20_4_ = uVar6;
  auVar84._24_4_ = uVar6;
  auVar84._28_4_ = uVar6;
  auVar51 = vcmpps_avx(local_320,auVar84,2);
  auVar63 = vandps_avx(auVar51,auVar63);
  auVar85._1_3_ = 0;
  auVar85[0] = bVar8;
  auVar85[4] = bVar8;
  auVar85._5_3_ = 0;
  auVar85[8] = bVar8;
  auVar85._9_3_ = 0;
  auVar85[0xc] = bVar8;
  auVar85._13_3_ = 0;
  auVar85[0x10] = bVar8;
  auVar85._17_3_ = 0;
  auVar85[0x14] = bVar8;
  auVar85._21_3_ = 0;
  auVar85[0x18] = bVar8;
  auVar85._25_3_ = 0;
  auVar85[0x1c] = bVar8;
  auVar85._29_3_ = 0;
  auVar51 = vpcmpgtd_avx2(auVar85,_DAT_0205a920);
  auVar63 = vandps_avx(auVar51,auVar63);
  auVar51 = auVar57 & auVar63;
  if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar51 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar51 >> 0x7f,0) != '\0') ||
        (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar51 >> 0xbf,0) != '\0') ||
      (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar51[0x1f] < '\0') {
    auVar51 = vunpckhps_avx(auVar59,local_300);
    auVar59 = vunpckhps_avx(local_260,local_2a0);
    auVar32._4_4_ = fVar19 * auVar59._4_4_;
    auVar32._0_4_ = fVar19 * auVar59._0_4_;
    auVar32._8_4_ = fVar19 * auVar59._8_4_;
    auVar32._12_4_ = fVar19 * auVar59._12_4_;
    auVar32._16_4_ = fVar19 * auVar59._16_4_;
    auVar32._20_4_ = fVar19 * auVar59._20_4_;
    auVar32._24_4_ = fVar19 * auVar59._24_4_;
    auVar32._28_4_ = fVar19;
    auVar87 = ZEXT3264(local_320);
    auVar31 = vfmadd231ps_fma(auVar32,auVar74,auVar51);
    auVar63 = vandps_avx(auVar57,auVar63);
    auVar30 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
    fVar19 = local_320._0_4_;
    fVar13 = local_320._4_4_;
    fVar14 = local_320._8_4_;
    fVar15 = local_320._12_4_;
    fVar16 = local_320._16_4_;
    fVar17 = local_320._20_4_;
    fVar18 = local_320._24_4_;
    auVar62._0_4_ = fVar1 * fVar19 + fVar5;
    auVar62._4_4_ = fVar1 * fVar13 + fVar5;
    auVar62._8_4_ = fVar1 * fVar14 + fVar5;
    auVar62._12_4_ = fVar1 * fVar15 + fVar5;
    auVar62._16_4_ = fVar1 * fVar16 + fVar5;
    auVar62._20_4_ = fVar1 * fVar17 + fVar5;
    auVar62._24_4_ = fVar1 * fVar18 + fVar5;
    auVar62._28_4_ = fVar5 + 0.0;
    auVar56._0_4_ = fVar19 * fVar2 + fVar4;
    auVar56._4_4_ = fVar13 * fVar2 + fVar4;
    auVar56._8_4_ = fVar14 * fVar2 + fVar4;
    auVar56._12_4_ = fVar15 * fVar2 + fVar4;
    auVar56._16_4_ = fVar16 * fVar2 + fVar4;
    auVar56._20_4_ = fVar17 * fVar2 + fVar4;
    auVar56._24_4_ = fVar18 * fVar2 + fVar4;
    auVar56._28_4_ = fVar4 + 0.0;
    auVar33._4_4_ = fVar13 * local_c0;
    auVar33._0_4_ = fVar19 * local_c0;
    auVar33._8_4_ = fVar14 * local_c0;
    auVar33._12_4_ = fVar15 * local_c0;
    auVar33._16_4_ = fVar16 * local_c0;
    auVar33._20_4_ = fVar17 * local_c0;
    auVar33._24_4_ = fVar18 * local_c0;
    auVar33._28_4_ = 0;
    auVar52._0_4_ = fVar19 * local_c0 + fVar3;
    auVar52._4_4_ = fVar13 * local_c0 + fVar3;
    auVar52._8_4_ = fVar14 * local_c0 + fVar3;
    auVar52._12_4_ = fVar15 * local_c0 + fVar3;
    auVar52._16_4_ = fVar16 * local_c0 + fVar3;
    auVar52._20_4_ = fVar17 * local_c0 + fVar3;
    auVar52._24_4_ = fVar18 * local_c0 + fVar3;
    auVar52._28_4_ = fVar3 + 0.0;
    auVar63 = vsubps_avx(auVar62,ZEXT1632(auVar78));
    auVar57 = vsubps_avx(auVar56,ZEXT1632(auVar28));
    auVar51 = vsubps_avx(auVar52,ZEXT1632(auVar29));
    auVar34._4_4_ = auVar51._4_4_ * auVar51._4_4_;
    auVar34._0_4_ = auVar51._0_4_ * auVar51._0_4_;
    auVar34._8_4_ = auVar51._8_4_ * auVar51._8_4_;
    auVar34._12_4_ = auVar51._12_4_ * auVar51._12_4_;
    auVar34._16_4_ = auVar51._16_4_ * auVar51._16_4_;
    auVar34._20_4_ = auVar51._20_4_ * auVar51._20_4_;
    auVar34._24_4_ = auVar51._24_4_ * auVar51._24_4_;
    auVar34._28_4_ = auVar51._28_4_;
    auVar78 = vfmadd231ps_fma(auVar34,auVar57,auVar57);
    auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar63,auVar63);
    auVar35._28_4_ = auVar57._28_4_;
    auVar35._0_28_ =
         ZEXT1628(CONCAT412(auVar31._12_4_ * auVar31._12_4_,
                            CONCAT48(auVar31._8_4_ * auVar31._8_4_,
                                     CONCAT44(auVar31._4_4_ * auVar31._4_4_,
                                              auVar31._0_4_ * auVar31._0_4_))));
    auVar63 = vcmpps_avx(ZEXT1632(auVar78),auVar35,1);
    auVar78 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
    auVar78 = vpand_avx(auVar78,auVar30);
    auVar63 = vpmovzxwd_avx2(auVar78);
    auVar63 = vpslld_avx2(auVar63,0x1f);
    if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar63 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar63 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar63 >> 0x7f,0) != '\0') ||
          (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar63 >> 0xbf,0) != '\0') ||
        (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar63[0x1f] < '\0')
    {
      local_280 = vpsrad_avx2(auVar63,0x1f);
      local_180 = 0;
      uStack_178 = 0;
      uStack_170 = 0;
      uStack_168 = 0;
      local_1a0 = 0;
      uStack_198 = 0;
      uStack_190 = 0;
      uStack_188 = 0;
      local_160 = local_320;
      local_140 = ZEXT1632(auVar25);
      local_120 = ZEXT1632(auVar26);
      local_100 = ZEXT1632(auVar27);
      auVar70._8_4_ = 0x7f800000;
      auVar70._0_8_ = 0x7f8000007f800000;
      auVar70._12_4_ = 0x7f800000;
      auVar70._16_4_ = 0x7f800000;
      auVar70._20_4_ = 0x7f800000;
      auVar70._24_4_ = 0x7f800000;
      auVar70._28_4_ = 0x7f800000;
      auVar71 = ZEXT3264(auVar70);
      auVar63 = vblendvps_avx(auVar70,local_320,auVar63);
      auVar57 = vshufps_avx(auVar63,auVar63,0xb1);
      auVar57 = vminps_avx(auVar63,auVar57);
      auVar51 = vshufpd_avx(auVar57,auVar57,5);
      auVar57 = vminps_avx(auVar57,auVar51);
      auVar51 = vpermpd_avx2(auVar57,0x4e);
      auVar57 = vminps_avx(auVar57,auVar51);
      auVar63 = vcmpps_avx(auVar63,auVar57,0);
      auVar25 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
      auVar78 = vpand_avx(auVar25,auVar78);
      auVar63 = vpmovzxwd_avx2(auVar78);
      auVar63 = vpslld_avx2(auVar63,0x1f);
      if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar63 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar63 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar63 >> 0x7f,0) == '\0') &&
            (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar63 >> 0xbf,0) == '\0') &&
          (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar63[0x1f])
      {
        auVar63 = local_280;
      }
      uVar36 = vmovmskps_avx(auVar63);
      uVar37 = 0;
      for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x80000000) {
        uVar37 = uVar37 + 1;
      }
      lVar49 = (long)(1 << ((uint)k & 0x1f)) * 0x10;
      auVar63 = vpcmpeqd_avx2(auVar33,auVar33);
      auVar75 = ZEXT3264(auVar63);
      auVar77 = ZEXT864(0) << 0x20;
      auVar78 = vpcmpeqd_avx(auVar29,auVar29);
      auVar80 = ZEXT1664(auVar78);
      auVar82 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
      local_2e0 = ray;
      local_2d8 = k;
      do {
        local_2d0.hit = local_230;
        local_2d0.valid = (int *)&local_330;
        uVar39 = (ulong)uVar37;
        local_1d0 = local_80[uVar39];
        pGVar10 = (pSVar9->geometries).items[local_1d0].ptr;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_280 + uVar39 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar6 = *(undefined4 *)((long)&local_1a0 + uVar39 * 4);
            uVar7 = *(undefined4 *)((long)&local_180 + uVar39 * 4);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar39 * 4);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_140 + uVar39 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_120 + uVar39 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_100 + uVar39 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar6;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
            *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[uVar39];
            *(uint *)(ray + k * 4 + 0x120) = local_1d0;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            return;
          }
          local_200 = *(undefined4 *)((long)&local_1a0 + uVar39 * 4);
          local_1f0 = *(undefined4 *)((long)&local_180 + uVar39 * 4);
          local_1e0 = (Disc->primIDs).field_0.i[uVar39];
          uVar6 = *(undefined4 *)(local_140 + uVar39 * 4);
          uVar7 = *(undefined4 *)(local_120 + uVar39 * 4);
          local_220._4_4_ = uVar7;
          local_220._0_4_ = uVar7;
          local_220._8_4_ = uVar7;
          local_220._12_4_ = uVar7;
          uVar7 = *(undefined4 *)(local_100 + uVar39 * 4);
          local_210._4_4_ = uVar7;
          local_210._0_4_ = uVar7;
          local_210._8_4_ = uVar7;
          local_210._12_4_ = uVar7;
          local_230[0] = (RTCHitN)(char)uVar6;
          local_230[1] = (RTCHitN)(char)((uint)uVar6 >> 8);
          local_230[2] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
          local_230[3] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
          local_230[4] = (RTCHitN)(char)uVar6;
          local_230[5] = (RTCHitN)(char)((uint)uVar6 >> 8);
          local_230[6] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
          local_230[7] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
          local_230[8] = (RTCHitN)(char)uVar6;
          local_230[9] = (RTCHitN)(char)((uint)uVar6 >> 8);
          local_230[10] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
          local_230[0xb] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
          local_230[0xc] = (RTCHitN)(char)uVar6;
          local_230[0xd] = (RTCHitN)(char)((uint)uVar6 >> 8);
          local_230[0xe] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
          local_230[0xf] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
          uStack_1fc = local_200;
          uStack_1f8 = local_200;
          uStack_1f4 = local_200;
          uStack_1ec = local_1f0;
          uStack_1e8 = local_1f0;
          uStack_1e4 = local_1f0;
          uStack_1dc = local_1e0;
          uStack_1d8 = local_1e0;
          uStack_1d4 = local_1e0;
          uStack_1cc = local_1d0;
          uStack_1c8 = local_1d0;
          uStack_1c4 = local_1d0;
          uStack_1bc = context->user->instID[0];
          local_1c0 = uStack_1bc;
          uStack_1b8 = uStack_1bc;
          uStack_1b4 = uStack_1bc;
          uStack_1b0 = context->user->instPrimID[0];
          uStack_1ac = uStack_1b0;
          uStack_1a8 = uStack_1b0;
          uStack_1a4 = uStack_1b0;
          local_260._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar39 * 4);
          local_330 = *(undefined8 *)(mm_lookupmask_ps + lVar49);
          uStack_328 = *(undefined8 *)(mm_lookupmask_ps + lVar49 + 8);
          local_2d0.geometryUserPtr = pGVar10->userPtr;
          local_2d0.context = context->user;
          local_2d0.N = 4;
          local_300._0_16_ = auVar82._0_16_;
          local_2d0.ray = (RTCRayN *)ray;
          if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_2a0._0_8_ = Disc;
            auVar63 = ZEXT1632(auVar75._0_16_);
            auVar78 = auVar80._0_16_;
            (*pGVar10->intersectionFilterN)(&local_2d0);
            auVar82 = ZEXT1664(local_300._0_16_);
            auVar78 = vpcmpeqd_avx(auVar78,auVar78);
            auVar80 = ZEXT1664(auVar78);
            auVar77 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar63 = vpcmpeqd_avx2(auVar63,auVar63);
            auVar75 = ZEXT3264(auVar63);
            auVar71 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar87 = ZEXT3264(local_320);
            Disc = (Primitive *)local_2a0._0_8_;
          }
          auVar25._8_8_ = uStack_328;
          auVar25._0_8_ = local_330;
          auVar78 = auVar80._0_16_;
          if (auVar25 == (undefined1  [16])0x0) {
            auVar25 = vpcmpeqd_avx(auVar77._0_16_,(undefined1  [16])0x0);
            auVar78 = auVar78 ^ auVar25;
          }
          else {
            p_Var12 = context->args->filter;
            if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              auVar63 = ZEXT1632(auVar75._0_16_);
              (*p_Var12)(&local_2d0);
              auVar82 = ZEXT1664(local_300._0_16_);
              auVar78 = vpcmpeqd_avx(auVar78,auVar78);
              auVar80 = ZEXT1664(auVar78);
              auVar77 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar63 = vpcmpeqd_avx2(auVar63,auVar63);
              auVar75 = ZEXT3264(auVar63);
              auVar71 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar87 = ZEXT3264(local_320);
            }
            auVar26._8_8_ = uStack_328;
            auVar26._0_8_ = local_330;
            auVar25 = vpcmpeqd_avx(auVar77._0_16_,auVar26);
            auVar78 = auVar80._0_16_ ^ auVar25;
            if (auVar26 != (undefined1  [16])0x0) {
              auVar25 = auVar80._0_16_ ^ auVar25;
              auVar26 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])local_2d0.hit);
              *(undefined1 (*) [16])(local_2d0.ray + 0xc0) = auVar26;
              auVar26 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])(local_2d0.hit + 0x10));
              *(undefined1 (*) [16])(local_2d0.ray + 0xd0) = auVar26;
              auVar26 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])(local_2d0.hit + 0x20));
              *(undefined1 (*) [16])(local_2d0.ray + 0xe0) = auVar26;
              auVar26 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])(local_2d0.hit + 0x30));
              *(undefined1 (*) [16])(local_2d0.ray + 0xf0) = auVar26;
              auVar26 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])(local_2d0.hit + 0x40));
              *(undefined1 (*) [16])(local_2d0.ray + 0x100) = auVar26;
              auVar26 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])(local_2d0.hit + 0x50));
              *(undefined1 (*) [16])(local_2d0.ray + 0x110) = auVar26;
              auVar26 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])(local_2d0.hit + 0x60));
              *(undefined1 (*) [16])(local_2d0.ray + 0x120) = auVar26;
              auVar26 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])(local_2d0.hit + 0x70));
              *(undefined1 (*) [16])(local_2d0.ray + 0x130) = auVar26;
              auVar25 = vmaskmovps_avx(auVar25,*(undefined1 (*) [16])(local_2d0.hit + 0x80));
              *(undefined1 (*) [16])(local_2d0.ray + 0x140) = auVar25;
            }
          }
          if ((auVar82._0_16_ & auVar78) == (undefined1  [16])0x0) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_260._0_4_;
          }
          *(undefined4 *)(local_280 + uVar39 * 4) = 0;
          uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar53._4_4_ = uVar6;
          auVar53._0_4_ = uVar6;
          auVar53._8_4_ = uVar6;
          auVar53._12_4_ = uVar6;
          auVar53._16_4_ = uVar6;
          auVar53._20_4_ = uVar6;
          auVar53._24_4_ = uVar6;
          auVar53._28_4_ = uVar6;
          auVar63 = vcmpps_avx(auVar87._0_32_,auVar53,2);
          local_280 = vandps_avx(auVar63,local_280);
        }
        if ((((((((local_280 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_280 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_280 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_280 >> 0x7f,0) == '\0') &&
              (local_280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_280 >> 0xbf,0) == '\0') &&
            (local_280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_280[0x1f]) {
          return;
        }
        auVar63 = vblendvps_avx(auVar71._0_32_,auVar87._0_32_,local_280);
        auVar57 = vshufps_avx(auVar63,auVar63,0xb1);
        auVar57 = vminps_avx(auVar63,auVar57);
        auVar51 = vshufpd_avx(auVar57,auVar57,5);
        auVar57 = vminps_avx(auVar57,auVar51);
        auVar51 = vpermpd_avx2(auVar57,0x4e);
        auVar57 = vminps_avx(auVar57,auVar51);
        auVar57 = vcmpps_avx(auVar63,auVar57,0);
        auVar51 = local_280 & auVar57;
        auVar63 = local_280;
        if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar51 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar51 >> 0x7f,0) != '\0') ||
              (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar51 >> 0xbf,0) != '\0') ||
            (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar51[0x1f] < '\0') {
          auVar63 = vandps_avx(auVar57,local_280);
        }
        uVar36 = vmovmskps_avx(auVar63);
        uVar37 = 0;
        for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x80000000) {
          uVar37 = uVar37 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }